

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EhFrame.cpp
# Opt level: O3

void __thiscall EhFrame::Entry::End(Entry *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  int iVar5;
  Writer *this_00;
  uint uVar6;
  ulong uVar7;
  
  if (this->beginOffset == 0xffffffffffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EhFrame.cpp"
                       ,0x7a,"(beginOffset != -1)","beginOffset != -1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00 = this->writer;
  iVar3 = (int)this_00->buffer;
  iVar5 = (int)this_00->cur;
  uVar6 = iVar3 - iVar5 & 7;
  uVar7 = (ulong)uVar6;
  if (uVar6 != 0) {
    do {
      Writer::Write<unsigned_char>(this->writer,'\0');
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    this_00 = this->writer;
    iVar3 = (int)this_00->buffer;
    iVar5 = (int)this_00->cur;
  }
  Writer::Write<unsigned_int>
            (this_00,this->beginOffset,(iVar5 - (iVar3 + (int)this->beginOffset)) - 4);
  return;
}

Assistant:

void EhFrame::Entry::End()
{
    Assert(beginOffset != -1); // Must have called Begin()

    // padding
    size_t padding = (MachPtr - writer->Count() % MachPtr) % MachPtr;
    for (size_t i = 0; i < padding; i++)
    {
        cfi_nop();
    }

    // update length record
    uword length = writer->Count() - beginOffset
                    - sizeof(length);  // exclude length itself
    writer->Write(beginOffset, length);
}